

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O2

void polyscope::draw(bool withUI,bool withContextCallback)

{
  element_type *peVar1;
  WeakHandle<polyscope::Widget> *pWVar2;
  Engine *pEVar3;
  bool bVar4;
  int iVar5;
  TransparencyMode TVar6;
  undefined7 in_register_00000039;
  WeakHandle<polyscope::Widget> *pWVar7;
  int iPass;
  pair<polyscope::Structure_*,_unsigned_long> pVar8;
  WeakHandle<polyscope::Widget> wHandle;
  
  processLazyProperties();
  (*render::engine->_vptr_Engine[0xe])();
  (*render::engine->_vptr_Engine[2])();
  render::Engine::setBackgroundColor(render::engine,(vec3)ZEXT812(0));
  render::Engine::setBackgroundAlpha(render::engine,0.0);
  (*render::engine->_vptr_Engine[1])();
  if ((int)CONCAT71(in_register_00000039,withUI) != 0) {
    (*render::engine->_vptr_Engine[0x1f])();
    if (*(char *)(DAT_0059cad8 + -8) == '\x01') {
      buildUserGuiAndInvokeCallback();
      if (options::buildGui == '\x01') {
        if (options::buildDefaultGuiPanels == '\x01') {
          buildPolyscopeGui();
          buildStructureGui();
          buildPickGui();
        }
        pWVar2 = DAT_0059cd68;
        for (pWVar7 = state::widgets; pWVar7 != pWVar2; pWVar7 = pWVar7 + 1) {
          WeakHandle<polyscope::Widget>::WeakHandle(&wHandle,pWVar7);
          bVar4 = GenericWeakHandle::isValid(&wHandle.super_GenericWeakHandle);
          if (bVar4) {
            (*(wHandle.targetPtr)->_vptr_Widget[4])();
          }
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    (&wHandle.super_GenericWeakHandle.sentinel.
                      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
      }
    }
  }
  if ((withContextCallback) && (*(long *)(DAT_0059cad8 + -0x18) != 0)) {
    std::function<void_()>::operator()((function<void_()> *)(DAT_0059cad8 + -0x28));
  }
  processLazyProperties();
  if (((anonymous_namespace)::redrawNextFrame != '\x01') || (options::alwaysRedraw == '\x01')) {
    processLazyProperties();
    (*render::engine->_vptr_Engine[0x2c])();
    pEVar3 = render::engine;
    peVar1 = (render::engine->sceneBuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar1->clearColor).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (peVar1->clearColor).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    (peVar1->clearColor).field_2.z = 0.0;
    peVar1 = (pEVar3->sceneBuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->clearAlpha = 0.0;
    (*peVar1->_vptr_FrameBuffer[4])();
    iVar5 = (*render::engine->_vptr_Engine[6])();
    if ((char)iVar5 != '\0') {
      view::ensureViewValid();
      if (options::renderScene == '\x01') {
        TVar6 = render::Engine::getTransparencyMode(render::engine);
        pEVar3 = render::engine;
        if (TVar6 == Pretty) {
          peVar1 = (render::engine->sceneBufferFinal).
                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (peVar1->clearColor).field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
          (peVar1->clearColor).field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
          (peVar1->clearColor).field_2.z = 0.0;
          peVar1 = (pEVar3->sceneBufferFinal).
                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          peVar1->clearAlpha = 0.0;
          (*peVar1->_vptr_FrameBuffer[4])();
          (*render::engine->_vptr_Engine[10])(render::engine,0);
          (*((render::engine->sceneDepthMinFrame).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_FrameBuffer[4])();
          for (iVar5 = 0; iVar5 < options::transparencyRenderPasses; iVar5 = iVar5 + 1) {
            (*render::engine->_vptr_Engine[6])();
            (*render::engine->_vptr_Engine[5])();
            (*render::engine->_vptr_Engine[0x2c])();
            drawStructures();
            render::GroundPlane::draw(&render::engine->groundPlane,iVar5 != 0);
            if (iVar5 == 0) {
              anon_unknown_1::renderSlicePlanes();
              (*render::engine->_vptr_Engine[0x2c])();
              drawStructuresDelayed();
            }
            (*((render::engine->sceneBufferFinal).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_FrameBuffer[2])();
            (*render::engine->_vptr_Engine[10])(render::engine,4);
            (*render::engine->_vptr_Engine[0xb])(render::engine,2);
            (*((render::engine->compositePeel).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ShaderProgram[0x24])();
            render::Engine::updateMinDepthTexture(render::engine);
          }
        }
        else {
          (*render::engine->_vptr_Engine[0x2c])();
          drawStructures();
          render::GroundPlane::draw(&render::engine->groundPlane,false);
          anon_unknown_1::renderSlicePlanes();
          (*render::engine->_vptr_Engine[0x2c])();
          drawStructuresDelayed();
          peVar1 = (render::engine->sceneBuffer).
                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (*peVar1->_vptr_FrameBuffer[0xe])
                    (peVar1,(render::engine->sceneBufferFinal).
                            super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        }
      }
    }
    (anonymous_namespace)::redrawNextFrame = '\x01';
  }
  (*render::engine->_vptr_Engine[2])();
  if (options::debugDrawPickBuffer == '\x01') {
    pVar8 = pick::evaluatePickQuery(-1,-1);
    peVar1 = (render::engine->pickFramebuffer).
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_FrameBuffer[0xe])
              (peVar1,(render::engine->displayBuffer).
                      super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,pVar8.second);
  }
  else {
    (*render::engine->_vptr_Engine[9])(render::engine,&render::engine->sceneColorFinal);
  }
  if (withUI) {
    (*render::engine->_vptr_Engine[2])();
    pWVar2 = DAT_0059cd68;
    for (pWVar7 = state::widgets; pWVar7 != pWVar2; pWVar7 = pWVar7 + 1) {
      WeakHandle<polyscope::Widget>::WeakHandle(&wHandle,pWVar7);
      bVar4 = GenericWeakHandle::isValid(&wHandle.super_GenericWeakHandle);
      if (bVar4) {
        (*(wHandle.targetPtr)->_vptr_Widget[2])();
      }
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&wHandle.super_GenericWeakHandle.sentinel.
                  super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    (*render::engine->_vptr_Engine[2])();
    (*render::engine->_vptr_Engine[0x20])();
  }
  return;
}

Assistant:

void draw(bool withUI, bool withContextCallback) {
  processLazyProperties();

  // Update buffer and context
  render::engine->makeContextCurrent();
  render::engine->bindDisplay();
  render::engine->setBackgroundColor({0., 0., 0.});
  render::engine->setBackgroundAlpha(0);
  render::engine->clearDisplay();

  if (withUI) {
    render::engine->ImGuiNewFrame();
  }

  // Build the GUI components
  if (withUI) {
    if (contextStack.back().drawDefaultUI) {

      // Note: It is important to build the user GUI first, because it is likely that callbacks there will modify
      // polyscope data. If we do these modifications happen later in the render cycle, they might invalidate data which
      // is necessary when ImGui::Render() happens below.
      buildUserGuiAndInvokeCallback();

      if (options::buildGui) {
        if (options::buildDefaultGuiPanels) {
          buildPolyscopeGui();
          buildStructureGui();
          buildPickGui();
        }

        for (WeakHandle<Widget> wHandle : state::widgets) {
          if (wHandle.isValid()) {
            Widget& w = wHandle.get();
            w.buildGUI();
          }
        }
      }
    }
  }

  // Execute the context callback, if there is one.
  // This callback is a Polyscope implementation detail, which is distinct from the userCallback (which gets called
  // above)
  if (withContextCallback && contextStack.back().callback) {
    (contextStack.back().callback)();
  }

  processLazyProperties();

  // Draw structures in the scene
  if (redrawNextFrame || options::alwaysRedraw) {
    renderScene();
    redrawNextFrame = false;
  }
  renderSceneToScreen();

  // Draw the GUI
  if (withUI) {
    // render widgets
    render::engine->bindDisplay();
    for (WeakHandle<Widget> wHandle : state::widgets) {
      if (wHandle.isValid()) {
        Widget& w = wHandle.get();
        w.draw();
      }
    }

    render::engine->bindDisplay();
    render::engine->ImGuiRender();
  }
}